

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

char * __thiscall
Corrade::Utility::String::Implementation::anon_unknown_13::anon_func::anon_class_1_0_00000001::
operator()(anon_class_1_0_00000001 *this,char *a,char *b,size_t sizeA,size_t sizeB)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  anon_class_1_0_00000001 *paVar10;
  anon_class_1_0_00000001 *paVar11;
  ostream *poVar12;
  long lVar13;
  undefined1 (*pauVar14) [32];
  long lVar15;
  anon_class_1_0_00000001 *paVar16;
  Error local_30;
  
  pcVar9 = b;
  if (sizeA < b) {
    pcVar9 = (char *)sizeA;
  }
  if (pcVar9 < (char *)0x20) {
    pcVar9 = operator()(this,a,b,sizeA,(size_t)pcVar9);
    return pcVar9;
  }
  auVar2 = vpcmpeqb_avx2(*(undefined1 (*) [32])this,*(undefined1 (*) [32])a);
  uVar8 = (uint)(SUB321(auVar2 >> 7,0) & 1) | (uint)(SUB321(auVar2 >> 0xf,0) & 1) << 1 |
          (uint)(SUB321(auVar2 >> 0x17,0) & 1) << 2 | (uint)(SUB321(auVar2 >> 0x1f,0) & 1) << 3 |
          (uint)(SUB321(auVar2 >> 0x27,0) & 1) << 4 | (uint)(SUB321(auVar2 >> 0x2f,0) & 1) << 5 |
          (uint)(SUB321(auVar2 >> 0x37,0) & 1) << 6 | (uint)(SUB321(auVar2 >> 0x3f,0) & 1) << 7 |
          (uint)(SUB321(auVar2 >> 0x47,0) & 1) << 8 | (uint)(SUB321(auVar2 >> 0x4f,0) & 1) << 9 |
          (uint)(SUB321(auVar2 >> 0x57,0) & 1) << 10 | (uint)(SUB321(auVar2 >> 0x5f,0) & 1) << 0xb |
          (uint)(SUB321(auVar2 >> 0x67,0) & 1) << 0xc | (uint)(SUB321(auVar2 >> 0x6f,0) & 1) << 0xd
          | (uint)(SUB321(auVar2 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar2 >> 0x7f,0) << 0xf |
          (uint)(SUB321(auVar2 >> 0x87,0) & 1) << 0x10 |
          (uint)(SUB321(auVar2 >> 0x8f,0) & 1) << 0x11 |
          (uint)(SUB321(auVar2 >> 0x97,0) & 1) << 0x12 |
          (uint)(SUB321(auVar2 >> 0x9f,0) & 1) << 0x13 |
          (uint)(SUB321(auVar2 >> 0xa7,0) & 1) << 0x14 |
          (uint)(SUB321(auVar2 >> 0xaf,0) & 1) << 0x15 |
          (uint)(SUB321(auVar2 >> 0xb7,0) & 1) << 0x16 | (uint)SUB321(auVar2 >> 0xbf,0) << 0x17 |
          (uint)(SUB321(auVar2 >> 199,0) & 1) << 0x18 | (uint)(SUB321(auVar2 >> 0xcf,0) & 1) << 0x19
          | (uint)(SUB321(auVar2 >> 0xd7,0) & 1) << 0x1a |
          (uint)(SUB321(auVar2 >> 0xdf,0) & 1) << 0x1b |
          (uint)(SUB321(auVar2 >> 0xe7,0) & 1) << 0x1c |
          (uint)(SUB321(auVar2 >> 0xef,0) & 1) << 0x1d |
          (uint)(SUB321(auVar2 >> 0xf7,0) & 1) << 0x1e | (uint)(byte)(auVar2[0x1f] >> 7) << 0x1f;
  if (uVar8 != 0xffffffff) {
LAB_0013f8aa:
    uVar7 = 0;
    for (uVar8 = ~uVar8; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x80000000) {
      uVar7 = uVar7 + 1;
    }
    return (char *)(this + uVar7);
  }
  paVar10 = (anon_class_1_0_00000001 *)((ulong)(this + 0x20) & 0xffffffffffffffe0);
  lVar13 = (long)paVar10 - (long)this;
  if ((paVar10 < this || lVar13 == 0) || (lVar13 < 1)) {
    poVar12 = Error::defaultOutput();
    Error::Error(&local_30,poVar12,(Flags)0x0);
    Debug::operator<<(&local_30.super_Debug,
                      "Assertion i > a && j > b && reinterpret_cast<std::uintptr_t>(i) % 32 == 0 failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/String.cpp:385"
                     );
  }
  else {
    pauVar14 = (undefined1 (*) [32])(a + lVar13);
    paVar16 = this + (long)pcVar9;
    if (paVar10 + 0x80 <= paVar16) {
      lVar13 = 0;
      do {
        lVar15 = lVar13;
        auVar3 = vpcmpeqb_avx2(*(undefined1 (*) [32])(*pauVar14 + lVar15),
                               *(undefined1 (*) [32])(paVar10 + lVar15));
        auVar4 = vpcmpeqb_avx2(*(undefined1 (*) [32])(pauVar14[1] + lVar15),
                               *(undefined1 (*) [32])(paVar10 + lVar15 + 0x20));
        auVar5 = vpcmpeqb_avx2(*(undefined1 (*) [32])(pauVar14[2] + lVar15),
                               *(undefined1 (*) [32])(paVar10 + lVar15 + 0x40));
        auVar6 = vpcmpeqb_avx2(*(undefined1 (*) [32])(pauVar14[3] + lVar15),
                               *(undefined1 (*) [32])(paVar10 + lVar15 + 0x60));
        auVar2 = vpand_avx2(auVar4,auVar3);
        auVar1 = vpand_avx2(auVar5,auVar6);
        auVar2 = vpand_avx2(auVar2,auVar1);
        if (((uint)(SUB321(auVar2 >> 7,0) & 1) | (uint)(SUB321(auVar2 >> 0xf,0) & 1) << 1 |
             (uint)(SUB321(auVar2 >> 0x17,0) & 1) << 2 | (uint)(SUB321(auVar2 >> 0x1f,0) & 1) << 3 |
             (uint)(SUB321(auVar2 >> 0x27,0) & 1) << 4 | (uint)(SUB321(auVar2 >> 0x2f,0) & 1) << 5 |
             (uint)(SUB321(auVar2 >> 0x37,0) & 1) << 6 | (uint)(SUB321(auVar2 >> 0x3f,0) & 1) << 7 |
             (uint)(SUB321(auVar2 >> 0x47,0) & 1) << 8 | (uint)(SUB321(auVar2 >> 0x4f,0) & 1) << 9 |
             (uint)(SUB321(auVar2 >> 0x57,0) & 1) << 10 |
             (uint)(SUB321(auVar2 >> 0x5f,0) & 1) << 0xb |
             (uint)(SUB321(auVar2 >> 0x67,0) & 1) << 0xc |
             (uint)(SUB321(auVar2 >> 0x6f,0) & 1) << 0xd |
             (uint)(SUB321(auVar2 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar2 >> 0x7f,0) << 0xf |
             (uint)(SUB321(auVar2 >> 0x87,0) & 1) << 0x10 |
             (uint)(SUB321(auVar2 >> 0x8f,0) & 1) << 0x11 |
             (uint)(SUB321(auVar2 >> 0x97,0) & 1) << 0x12 |
             (uint)(SUB321(auVar2 >> 0x9f,0) & 1) << 0x13 |
             (uint)(SUB321(auVar2 >> 0xa7,0) & 1) << 0x14 |
             (uint)(SUB321(auVar2 >> 0xaf,0) & 1) << 0x15 |
             (uint)(SUB321(auVar2 >> 0xb7,0) & 1) << 0x16 | (uint)SUB321(auVar2 >> 0xbf,0) << 0x17 |
             (uint)(SUB321(auVar2 >> 199,0) & 1) << 0x18 |
             (uint)(SUB321(auVar2 >> 0xcf,0) & 1) << 0x19 |
             (uint)(SUB321(auVar2 >> 0xd7,0) & 1) << 0x1a |
             (uint)(SUB321(auVar2 >> 0xdf,0) & 1) << 0x1b |
             (uint)(SUB321(auVar2 >> 0xe7,0) & 1) << 0x1c |
             (uint)(SUB321(auVar2 >> 0xef,0) & 1) << 0x1d |
             (uint)(SUB321(auVar2 >> 0xf7,0) & 1) << 0x1e | (uint)(byte)(auVar2[0x1f] >> 7) << 0x1f)
            != 0xffffffff) {
          uVar8 = (uint)(SUB321(auVar3 >> 7,0) & 1) | (uint)(SUB321(auVar3 >> 0xf,0) & 1) << 1 |
                  (uint)(SUB321(auVar3 >> 0x17,0) & 1) << 2 |
                  (uint)(SUB321(auVar3 >> 0x1f,0) & 1) << 3 |
                  (uint)(SUB321(auVar3 >> 0x27,0) & 1) << 4 |
                  (uint)(SUB321(auVar3 >> 0x2f,0) & 1) << 5 |
                  (uint)(SUB321(auVar3 >> 0x37,0) & 1) << 6 |
                  (uint)(SUB321(auVar3 >> 0x3f,0) & 1) << 7 |
                  (uint)(SUB321(auVar3 >> 0x47,0) & 1) << 8 |
                  (uint)(SUB321(auVar3 >> 0x4f,0) & 1) << 9 |
                  (uint)(SUB321(auVar3 >> 0x57,0) & 1) << 10 |
                  (uint)(SUB321(auVar3 >> 0x5f,0) & 1) << 0xb |
                  (uint)(SUB321(auVar3 >> 0x67,0) & 1) << 0xc |
                  (uint)(SUB321(auVar3 >> 0x6f,0) & 1) << 0xd |
                  (uint)(SUB321(auVar3 >> 0x77,0) & 1) << 0xe |
                  (uint)SUB321(auVar3 >> 0x7f,0) << 0xf |
                  (uint)(SUB321(auVar3 >> 0x87,0) & 1) << 0x10 |
                  (uint)(SUB321(auVar3 >> 0x8f,0) & 1) << 0x11 |
                  (uint)(SUB321(auVar3 >> 0x97,0) & 1) << 0x12 |
                  (uint)(SUB321(auVar3 >> 0x9f,0) & 1) << 0x13 |
                  (uint)(SUB321(auVar3 >> 0xa7,0) & 1) << 0x14 |
                  (uint)(SUB321(auVar3 >> 0xaf,0) & 1) << 0x15 |
                  (uint)(SUB321(auVar3 >> 0xb7,0) & 1) << 0x16 |
                  (uint)SUB321(auVar3 >> 0xbf,0) << 0x17 |
                  (uint)(SUB321(auVar3 >> 199,0) & 1) << 0x18 |
                  (uint)(SUB321(auVar3 >> 0xcf,0) & 1) << 0x19 |
                  (uint)(SUB321(auVar3 >> 0xd7,0) & 1) << 0x1a |
                  (uint)(SUB321(auVar3 >> 0xdf,0) & 1) << 0x1b |
                  (uint)(SUB321(auVar3 >> 0xe7,0) & 1) << 0x1c |
                  (uint)(SUB321(auVar3 >> 0xef,0) & 1) << 0x1d |
                  (uint)(SUB321(auVar3 >> 0xf7,0) & 1) << 0x1e |
                  (uint)(byte)(auVar3[0x1f] >> 7) << 0x1f;
          if (uVar8 != 0xffffffff) {
            uVar7 = 0;
            for (uVar8 = ~uVar8; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x80000000) {
              uVar7 = uVar7 + 1;
            }
            paVar10 = paVar10 + lVar15;
            goto LAB_0013f9e8;
          }
          uVar8 = (uint)(SUB321(auVar4 >> 7,0) & 1) | (uint)(SUB321(auVar4 >> 0xf,0) & 1) << 1 |
                  (uint)(SUB321(auVar4 >> 0x17,0) & 1) << 2 |
                  (uint)(SUB321(auVar4 >> 0x1f,0) & 1) << 3 |
                  (uint)(SUB321(auVar4 >> 0x27,0) & 1) << 4 |
                  (uint)(SUB321(auVar4 >> 0x2f,0) & 1) << 5 |
                  (uint)(SUB321(auVar4 >> 0x37,0) & 1) << 6 |
                  (uint)(SUB321(auVar4 >> 0x3f,0) & 1) << 7 |
                  (uint)(SUB321(auVar4 >> 0x47,0) & 1) << 8 |
                  (uint)(SUB321(auVar4 >> 0x4f,0) & 1) << 9 |
                  (uint)(SUB321(auVar4 >> 0x57,0) & 1) << 10 |
                  (uint)(SUB321(auVar4 >> 0x5f,0) & 1) << 0xb |
                  (uint)(SUB321(auVar4 >> 0x67,0) & 1) << 0xc |
                  (uint)(SUB321(auVar4 >> 0x6f,0) & 1) << 0xd |
                  (uint)(SUB321(auVar4 >> 0x77,0) & 1) << 0xe |
                  (uint)SUB321(auVar4 >> 0x7f,0) << 0xf |
                  (uint)(SUB321(auVar4 >> 0x87,0) & 1) << 0x10 |
                  (uint)(SUB321(auVar4 >> 0x8f,0) & 1) << 0x11 |
                  (uint)(SUB321(auVar4 >> 0x97,0) & 1) << 0x12 |
                  (uint)(SUB321(auVar4 >> 0x9f,0) & 1) << 0x13 |
                  (uint)(SUB321(auVar4 >> 0xa7,0) & 1) << 0x14 |
                  (uint)(SUB321(auVar4 >> 0xaf,0) & 1) << 0x15 |
                  (uint)(SUB321(auVar4 >> 0xb7,0) & 1) << 0x16 |
                  (uint)SUB321(auVar4 >> 0xbf,0) << 0x17 |
                  (uint)(SUB321(auVar4 >> 199,0) & 1) << 0x18 |
                  (uint)(SUB321(auVar4 >> 0xcf,0) & 1) << 0x19 |
                  (uint)(SUB321(auVar4 >> 0xd7,0) & 1) << 0x1a |
                  (uint)(SUB321(auVar4 >> 0xdf,0) & 1) << 0x1b |
                  (uint)(SUB321(auVar4 >> 0xe7,0) & 1) << 0x1c |
                  (uint)(SUB321(auVar4 >> 0xef,0) & 1) << 0x1d |
                  (uint)(SUB321(auVar4 >> 0xf7,0) & 1) << 0x1e |
                  (uint)(byte)(auVar4[0x1f] >> 7) << 0x1f;
          if (uVar8 != 0xffffffff) {
            uVar7 = 0;
            for (uVar8 = ~uVar8; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x80000000) {
              uVar7 = uVar7 + 1;
            }
            return (char *)(paVar10 + lVar15 + (ulong)uVar7 + 0x20);
          }
          uVar8 = (uint)(SUB321(auVar5 >> 7,0) & 1) | (uint)(SUB321(auVar5 >> 0xf,0) & 1) << 1 |
                  (uint)(SUB321(auVar5 >> 0x17,0) & 1) << 2 |
                  (uint)(SUB321(auVar5 >> 0x1f,0) & 1) << 3 |
                  (uint)(SUB321(auVar5 >> 0x27,0) & 1) << 4 |
                  (uint)(SUB321(auVar5 >> 0x2f,0) & 1) << 5 |
                  (uint)(SUB321(auVar5 >> 0x37,0) & 1) << 6 |
                  (uint)(SUB321(auVar5 >> 0x3f,0) & 1) << 7 |
                  (uint)(SUB321(auVar5 >> 0x47,0) & 1) << 8 |
                  (uint)(SUB321(auVar5 >> 0x4f,0) & 1) << 9 |
                  (uint)(SUB321(auVar5 >> 0x57,0) & 1) << 10 |
                  (uint)(SUB321(auVar5 >> 0x5f,0) & 1) << 0xb |
                  (uint)(SUB321(auVar5 >> 0x67,0) & 1) << 0xc |
                  (uint)(SUB321(auVar5 >> 0x6f,0) & 1) << 0xd |
                  (uint)(SUB321(auVar5 >> 0x77,0) & 1) << 0xe |
                  (uint)SUB321(auVar5 >> 0x7f,0) << 0xf |
                  (uint)(SUB321(auVar5 >> 0x87,0) & 1) << 0x10 |
                  (uint)(SUB321(auVar5 >> 0x8f,0) & 1) << 0x11 |
                  (uint)(SUB321(auVar5 >> 0x97,0) & 1) << 0x12 |
                  (uint)(SUB321(auVar5 >> 0x9f,0) & 1) << 0x13 |
                  (uint)(SUB321(auVar5 >> 0xa7,0) & 1) << 0x14 |
                  (uint)(SUB321(auVar5 >> 0xaf,0) & 1) << 0x15 |
                  (uint)(SUB321(auVar5 >> 0xb7,0) & 1) << 0x16 |
                  (uint)SUB321(auVar5 >> 0xbf,0) << 0x17 |
                  (uint)(SUB321(auVar5 >> 199,0) & 1) << 0x18 |
                  (uint)(SUB321(auVar5 >> 0xcf,0) & 1) << 0x19 |
                  (uint)(SUB321(auVar5 >> 0xd7,0) & 1) << 0x1a |
                  (uint)(SUB321(auVar5 >> 0xdf,0) & 1) << 0x1b |
                  (uint)(SUB321(auVar5 >> 0xe7,0) & 1) << 0x1c |
                  (uint)(SUB321(auVar5 >> 0xef,0) & 1) << 0x1d |
                  (uint)(SUB321(auVar5 >> 0xf7,0) & 1) << 0x1e |
                  (uint)(byte)(auVar5[0x1f] >> 7) << 0x1f;
          if (uVar8 != 0xffffffff) {
            uVar7 = 0;
            for (uVar8 = ~uVar8; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x80000000) {
              uVar7 = uVar7 + 1;
            }
            return (char *)(paVar10 + lVar15 + (ulong)uVar7 + 0x40);
          }
          uVar8 = (uint)(SUB321(auVar6 >> 7,0) & 1) | (uint)(SUB321(auVar6 >> 0xf,0) & 1) << 1 |
                  (uint)(SUB321(auVar6 >> 0x17,0) & 1) << 2 |
                  (uint)(SUB321(auVar6 >> 0x1f,0) & 1) << 3 |
                  (uint)(SUB321(auVar6 >> 0x27,0) & 1) << 4 |
                  (uint)(SUB321(auVar6 >> 0x2f,0) & 1) << 5 |
                  (uint)(SUB321(auVar6 >> 0x37,0) & 1) << 6 |
                  (uint)(SUB321(auVar6 >> 0x3f,0) & 1) << 7 |
                  (uint)(SUB321(auVar6 >> 0x47,0) & 1) << 8 |
                  (uint)(SUB321(auVar6 >> 0x4f,0) & 1) << 9 |
                  (uint)(SUB321(auVar6 >> 0x57,0) & 1) << 10 |
                  (uint)(SUB321(auVar6 >> 0x5f,0) & 1) << 0xb |
                  (uint)(SUB321(auVar6 >> 0x67,0) & 1) << 0xc |
                  (uint)(SUB321(auVar6 >> 0x6f,0) & 1) << 0xd |
                  (uint)(SUB321(auVar6 >> 0x77,0) & 1) << 0xe |
                  (uint)SUB321(auVar6 >> 0x7f,0) << 0xf |
                  (uint)(SUB321(auVar6 >> 0x87,0) & 1) << 0x10 |
                  (uint)(SUB321(auVar6 >> 0x8f,0) & 1) << 0x11 |
                  (uint)(SUB321(auVar6 >> 0x97,0) & 1) << 0x12 |
                  (uint)(SUB321(auVar6 >> 0x9f,0) & 1) << 0x13 |
                  (uint)(SUB321(auVar6 >> 0xa7,0) & 1) << 0x14 |
                  (uint)(SUB321(auVar6 >> 0xaf,0) & 1) << 0x15 |
                  (uint)(SUB321(auVar6 >> 0xb7,0) & 1) << 0x16 |
                  (uint)SUB321(auVar6 >> 0xbf,0) << 0x17 |
                  (uint)(SUB321(auVar6 >> 199,0) & 1) << 0x18 |
                  (uint)(SUB321(auVar6 >> 0xcf,0) & 1) << 0x19 |
                  (uint)(SUB321(auVar6 >> 0xd7,0) & 1) << 0x1a |
                  (uint)(SUB321(auVar6 >> 0xdf,0) & 1) << 0x1b |
                  (uint)(SUB321(auVar6 >> 0xe7,0) & 1) << 0x1c |
                  (uint)(SUB321(auVar6 >> 0xef,0) & 1) << 0x1d |
                  (uint)(SUB321(auVar6 >> 0xf7,0) & 1) << 0x1e |
                  (uint)(byte)(auVar6[0x1f] >> 7) << 0x1f;
          if (uVar8 != 0xffffffff) {
            uVar7 = 0;
            for (uVar8 = ~uVar8; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x80000000) {
              uVar7 = uVar7 + 1;
            }
            return (char *)(paVar10 + lVar15 + (ulong)uVar7 + 0x60);
          }
          poVar12 = Error::defaultOutput();
          Error::Error(&local_30,poVar12,(Flags)0x0);
          Debug::operator<<(&local_30.super_Debug,
                            "Reached unreachable code at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/String.cpp:424"
                           );
          goto LAB_0013faa4;
        }
        lVar13 = lVar15 + 0x80;
      } while (paVar10 + lVar15 + 0x100 <= paVar16);
      paVar10 = paVar10 + lVar15 + 0x80;
      pauVar14 = (undefined1 (*) [32])(pauVar14[4] + lVar15);
    }
    paVar11 = paVar10 + 0x20;
    while (paVar11 <= paVar16) {
      auVar2 = vpcmpeqb_avx2(*(undefined1 (*) [32])paVar10,*pauVar14);
      uVar8 = (uint)(SUB321(auVar2 >> 7,0) & 1) | (uint)(SUB321(auVar2 >> 0xf,0) & 1) << 1 |
              (uint)(SUB321(auVar2 >> 0x17,0) & 1) << 2 | (uint)(SUB321(auVar2 >> 0x1f,0) & 1) << 3
              | (uint)(SUB321(auVar2 >> 0x27,0) & 1) << 4 |
              (uint)(SUB321(auVar2 >> 0x2f,0) & 1) << 5 | (uint)(SUB321(auVar2 >> 0x37,0) & 1) << 6
              | (uint)(SUB321(auVar2 >> 0x3f,0) & 1) << 7 |
              (uint)(SUB321(auVar2 >> 0x47,0) & 1) << 8 | (uint)(SUB321(auVar2 >> 0x4f,0) & 1) << 9
              | (uint)(SUB321(auVar2 >> 0x57,0) & 1) << 10 |
              (uint)(SUB321(auVar2 >> 0x5f,0) & 1) << 0xb |
              (uint)(SUB321(auVar2 >> 0x67,0) & 1) << 0xc |
              (uint)(SUB321(auVar2 >> 0x6f,0) & 1) << 0xd |
              (uint)(SUB321(auVar2 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar2 >> 0x7f,0) << 0xf |
              (uint)(SUB321(auVar2 >> 0x87,0) & 1) << 0x10 |
              (uint)(SUB321(auVar2 >> 0x8f,0) & 1) << 0x11 |
              (uint)(SUB321(auVar2 >> 0x97,0) & 1) << 0x12 |
              (uint)(SUB321(auVar2 >> 0x9f,0) & 1) << 0x13 |
              (uint)(SUB321(auVar2 >> 0xa7,0) & 1) << 0x14 |
              (uint)(SUB321(auVar2 >> 0xaf,0) & 1) << 0x15 |
              (uint)(SUB321(auVar2 >> 0xb7,0) & 1) << 0x16 | (uint)SUB321(auVar2 >> 0xbf,0) << 0x17
              | (uint)(SUB321(auVar2 >> 199,0) & 1) << 0x18 |
              (uint)(SUB321(auVar2 >> 0xcf,0) & 1) << 0x19 |
              (uint)(SUB321(auVar2 >> 0xd7,0) & 1) << 0x1a |
              (uint)(SUB321(auVar2 >> 0xdf,0) & 1) << 0x1b |
              (uint)(SUB321(auVar2 >> 0xe7,0) & 1) << 0x1c |
              (uint)(SUB321(auVar2 >> 0xef,0) & 1) << 0x1d |
              (uint)(SUB321(auVar2 >> 0xf7,0) & 1) << 0x1e | (uint)(byte)(auVar2[0x1f] >> 7) << 0x1f
      ;
      if (uVar8 != 0xffffffff) {
        uVar7 = 0;
        for (uVar8 = ~uVar8; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x80000000) {
          uVar7 = uVar7 + 1;
        }
LAB_0013f9e8:
        return (char *)(paVar10 + uVar7);
      }
      pauVar14 = pauVar14 + 1;
      paVar11 = paVar10 + 0x40;
      paVar10 = paVar10 + 0x20;
    }
    if (paVar16 <= paVar10) {
      return (char *)paVar16;
    }
    if ((long)(a + (long)pcVar9) - (long)pauVar14 == (long)paVar16 - (long)paVar10) {
      auVar2 = vpcmpeqb_avx2(*(undefined1 (*) [32])(paVar16 + -0x20),
                             *(undefined1 (*) [32])(a + (long)pcVar9 + -0x20));
      uVar8 = (uint)(SUB321(auVar2 >> 7,0) & 1) | (uint)(SUB321(auVar2 >> 0xf,0) & 1) << 1 |
              (uint)(SUB321(auVar2 >> 0x17,0) & 1) << 2 | (uint)(SUB321(auVar2 >> 0x1f,0) & 1) << 3
              | (uint)(SUB321(auVar2 >> 0x27,0) & 1) << 4 |
              (uint)(SUB321(auVar2 >> 0x2f,0) & 1) << 5 | (uint)(SUB321(auVar2 >> 0x37,0) & 1) << 6
              | (uint)(SUB321(auVar2 >> 0x3f,0) & 1) << 7 |
              (uint)(SUB321(auVar2 >> 0x47,0) & 1) << 8 | (uint)(SUB321(auVar2 >> 0x4f,0) & 1) << 9
              | (uint)(SUB321(auVar2 >> 0x57,0) & 1) << 10 |
              (uint)(SUB321(auVar2 >> 0x5f,0) & 1) << 0xb |
              (uint)(SUB321(auVar2 >> 0x67,0) & 1) << 0xc |
              (uint)(SUB321(auVar2 >> 0x6f,0) & 1) << 0xd |
              (uint)(SUB321(auVar2 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar2 >> 0x7f,0) << 0xf |
              (uint)(SUB321(auVar2 >> 0x87,0) & 1) << 0x10 |
              (uint)(SUB321(auVar2 >> 0x8f,0) & 1) << 0x11 |
              (uint)(SUB321(auVar2 >> 0x97,0) & 1) << 0x12 |
              (uint)(SUB321(auVar2 >> 0x9f,0) & 1) << 0x13 |
              (uint)(SUB321(auVar2 >> 0xa7,0) & 1) << 0x14 |
              (uint)(SUB321(auVar2 >> 0xaf,0) & 1) << 0x15 |
              (uint)(SUB321(auVar2 >> 0xb7,0) & 1) << 0x16 | (uint)SUB321(auVar2 >> 0xbf,0) << 0x17
              | (uint)(SUB321(auVar2 >> 199,0) & 1) << 0x18 |
              (uint)(SUB321(auVar2 >> 0xcf,0) & 1) << 0x19 |
              (uint)(SUB321(auVar2 >> 0xd7,0) & 1) << 0x1a |
              (uint)(SUB321(auVar2 >> 0xdf,0) & 1) << 0x1b |
              (uint)(SUB321(auVar2 >> 0xe7,0) & 1) << 0x1c |
              (uint)(SUB321(auVar2 >> 0xef,0) & 1) << 0x1d |
              (uint)(SUB321(auVar2 >> 0xf7,0) & 1) << 0x1e | (uint)(byte)(auVar2[0x1f] >> 7) << 0x1f
      ;
      if (uVar8 == 0xffffffff) {
        return (char *)paVar16;
      }
      this = paVar16 + -0x20;
      goto LAB_0013f8aa;
    }
    poVar12 = Error::defaultOutput();
    Error::Error(&local_30,poVar12,(Flags)0x0);
    Debug::operator<<(&local_30.super_Debug,
                      "Assertion i + 32 > endA && endB - j == endA - i failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/String.cpp:441"
                     );
  }
LAB_0013faa4:
  Error::~Error(&local_30);
  abort();
}

Assistant:

void ltrimInPlace(std::string& string, const Containers::ArrayView<const char> characters) {
    string.erase(0, string.find_first_not_of(characters, 0, characters.size()));
}